

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O0

Vec_Int_t * Acec_TreeFindPoints(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Bit_t *vIgnore)

{
  int iVar1;
  Vec_Int_t *vMap_00;
  undefined4 local_2c;
  int i;
  Vec_Int_t *vMap;
  Vec_Bit_t *vIgnore_local;
  Vec_Int_t *vAdds_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  vMap_00 = Vec_IntStartFull(iVar1 << 1);
  local_2c = 0;
  do {
    iVar1 = Vec_IntSize(vAdds);
    if (iVar1 <= local_2c * 6) {
      return vMap_00;
    }
    if (vIgnore == (Vec_Bit_t *)0x0) {
LAB_00831bba:
      iVar1 = Vec_IntEntry(vAdds,local_2c * 6);
      Acec_TreeAddInOutPoint(vMap_00,iVar1,local_2c,0);
      iVar1 = Vec_IntEntry(vAdds,local_2c * 6 + 1);
      Acec_TreeAddInOutPoint(vMap_00,iVar1,local_2c,0);
      iVar1 = Vec_IntEntry(vAdds,local_2c * 6 + 2);
      Acec_TreeAddInOutPoint(vMap_00,iVar1,local_2c,0);
      iVar1 = Vec_IntEntry(vAdds,local_2c * 6 + 3);
      Acec_TreeAddInOutPoint(vMap_00,iVar1,local_2c,1);
      iVar1 = Vec_IntEntry(vAdds,local_2c * 6 + 4);
      Acec_TreeAddInOutPoint(vMap_00,iVar1,local_2c,1);
    }
    else {
      iVar1 = Vec_IntEntry(vAdds,local_2c * 6 + 3);
      iVar1 = Vec_BitEntry(vIgnore,iVar1);
      if (iVar1 == 0) {
        iVar1 = Vec_IntEntry(vAdds,local_2c * 6 + 4);
        iVar1 = Vec_BitEntry(vIgnore,iVar1);
        if (iVar1 == 0) goto LAB_00831bba;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Acec_TreeFindPoints( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Bit_t * vIgnore )
{
    Vec_Int_t * vMap = Vec_IntStartFull( 2*Gia_ManObjNum(p) );
    int i;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
    {
        if ( vIgnore && (Vec_BitEntry(vIgnore, Vec_IntEntry(vAdds, 6*i+3)) || Vec_BitEntry(vIgnore, Vec_IntEntry(vAdds, 6*i+4))) )
            continue;
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+0), i, 0 );
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+1), i, 0 );
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+2), i, 0 );
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+3), i, 1 );
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+4), i, 1 );
    }
    return vMap;
}